

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_name(char *name)

{
  mbedtls_ecp_curve_info *pmVar1;
  int iVar2;
  mbedtls_ecp_curve_info *pmVar3;
  
  if (name != (char *)0x0) {
    pmVar3 = ecp_supported_curves;
    do {
      iVar2 = strcmp(pmVar3->name,name);
      if (iVar2 == 0) {
        return pmVar3;
      }
      pmVar1 = pmVar3 + 1;
      pmVar3 = pmVar3 + 1;
    } while (pmVar1->grp_id != MBEDTLS_ECP_DP_NONE);
  }
  return (mbedtls_ecp_curve_info *)0x0;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_name( const char *name )
{
    const mbedtls_ecp_curve_info *curve_info;

    if( name == NULL )
        return( NULL );

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( strcmp( curve_info->name, name ) == 0 )
            return( curve_info );
    }

    return( NULL );
}